

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_string_field.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::InlinedStringField::Release_abi_cxx11_
          (InlinedStringField *this,Arena *arena,bool donated)

{
  size_type *psVar1;
  size_type *psVar2;
  undefined8 uVar3;
  string *psVar4;
  
  psVar4 = (string *)operator_new(0x20);
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  psVar2 = (size_type *)(this->field_0).str_._M_dataplus._M_p;
  if (arena == (Arena *)0x0 || !donated) {
    psVar1 = (size_type *)((long)&this->field_0 + 0x10);
    if (psVar2 == psVar1) {
      uVar3 = *(undefined8 *)((long)&this->field_0 + 0x18);
      (psVar4->field_2)._M_allocated_capacity = *psVar1;
      *(undefined8 *)((long)&psVar4->field_2 + 8) = uVar3;
    }
    else {
      (psVar4->_M_dataplus)._M_p = (pointer)psVar2;
      (psVar4->field_2)._M_allocated_capacity = *psVar1;
    }
    psVar4->_M_string_length = (this->field_0).str_._M_string_length;
    *(size_type **)&this->field_0 = psVar1;
    (this->field_0).str_._M_string_length = 0;
    *(undefined1 *)((long)&this->field_0 + 0x10) = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar4,psVar2,(long)psVar2 + (this->field_0).str_._M_string_length);
  }
  (this->field_0).str_._M_string_length = 0;
  **(undefined1 **)&this->field_0 = 0;
  return psVar4;
}

Assistant:

std::string* InlinedStringField::Release(Arena* arena, bool donated) {
  // We can not steal donated arena strings.
  std::string* released = (arena != nullptr && donated)
                              ? new std::string(*get_mutable())
                              : new std::string(std::move(*get_mutable()));
  get_mutable()->clear();
  return released;
}